

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandInsWin(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nDist;
  Io_FileType_t FileType;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pCare;
  int iVar3;
  char *pcVar4;
  uint fVerbose;
  Abc_Ntk_t *pNtkTemp;
  uint local_48;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  nDist = 5;
  local_48 = 0xffffffff;
  do {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"NDvh"), iVar3 = globalUtilOptind, iVar1 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          pcVar4 = "Empty network.\n";
        }
        else if (pAVar2->ntkType == ABC_NTK_STRASH) {
          if (globalUtilOptind + 1 == argc) {
            pcVar4 = argv[globalUtilOptind];
            FileType = Io_ReadFileType(pcVar4);
            iVar3 = 1;
            pNtk = Io_Read(pcVar4,FileType,1,0);
            if (pNtk == (Abc_Ntk_t *)0x0) {
              pcVar4 = "Reading care network has failed.\n";
            }
            else {
              pCare = pNtk;
              if (pNtk->ntkType != ABC_NTK_STRASH) {
                pCare = Abc_NtkStrash(pNtk,0,1,0);
                Abc_NtkDelete(pNtk);
              }
              pAVar2 = Abc_NtkDarInsWin(pAVar2,pCare,local_48,nDist,fVerbose);
              Abc_NtkDelete(pCare);
              if (pAVar2 != (Abc_Ntk_t *)0x0) {
                Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
                return 0;
              }
              pcVar4 = "Inserting sequential window has failed.\n";
              iVar3 = 0;
            }
            Abc_Print(-1,pcVar4);
            return iVar3;
          }
          pcVar4 = "Not enough command-line arguments.\n";
        }
        else {
          pcVar4 = "Only works for structrally hashed networks.\n";
        }
        iVar3 = -1;
        goto LAB_00208af3;
      }
      if (iVar1 == 0x44) break;
      if (iVar1 != 0x4e) goto LAB_00208a66;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
LAB_00208a58:
        Abc_Print(-1,pcVar4);
        goto LAB_00208a66;
      }
      local_48 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      if ((int)local_48 < 1) goto LAB_00208a66;
    }
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-D\" should be followed by an integer.\n";
      goto LAB_00208a58;
    }
    nDist = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
  } while (0 < (int)nDist);
LAB_00208a66:
  iVar3 = -2;
  Abc_Print(-2,"usage: inswin [-ND <num>] [-vh] <file>\n");
  Abc_Print(-2,"\t         inserts sequential window into the AIG\n");
  Abc_Print(-2,"\t-N num : the ID of the object to use as the center [default = %d]\n",
            (ulong)local_48);
  Abc_Print(-2,"\t-D num : the \"radius\" of the window [default = %d]\n",(ulong)nDist);
  pcVar4 = "yes";
  if (fVerbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  pcVar4 = "\tfile   : file with the AIG to be inserted\n";
LAB_00208af3:
  Abc_Print(iVar3,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandInsWin( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtkRes, * pNtk, * pNtkCare;
    int c;
    int nObjId;
    int nDist;
    int fVerbose;

    extern Abc_Ntk_t * Abc_NtkDarInsWin( Abc_Ntk_t * pNtk, Abc_Ntk_t * pWnd, int nObjId, int nDist, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nObjId   = -1;
    nDist    =  5;
    fVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NDvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nObjId = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nObjId <= 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nDist = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nDist <= 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for structrally hashed networks.\n" );
        return 1;
    }

    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Not enough command-line arguments.\n" );
        return 1;
    }
    pNtkCare = Io_Read( argv[globalUtilOptind], Io_ReadFileType(argv[globalUtilOptind]), 1, 0 );
    if ( pNtkCare == NULL )
    {
        Abc_Print( -1, "Reading care network has failed.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtkCare) )
    {
        Abc_Ntk_t * pNtkTemp;
        pNtkCare = Abc_NtkStrash( pNtkTemp = pNtkCare, 0, 1, 0 );
        Abc_NtkDelete( pNtkTemp );
    }
    // modify the current network
    pNtkRes = Abc_NtkDarInsWin( pNtk, pNtkCare, nObjId, nDist, fVerbose );
    Abc_NtkDelete( pNtkCare );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Inserting sequential window has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: inswin [-ND <num>] [-vh] <file>\n" );
    Abc_Print( -2, "\t         inserts sequential window into the AIG\n" );
    Abc_Print( -2, "\t-N num : the ID of the object to use as the center [default = %d]\n", nObjId );
    Abc_Print( -2, "\t-D num : the \"radius\" of the window [default = %d]\n", nDist );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tfile   : file with the AIG to be inserted\n");
    return 1;
}